

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::buildMathChildIdMap
          (ValidatorImpl *this,XmlNodePtr *node,string *infoRef,IdMap *idMap)

{
  undefined8 uVar1;
  bool bVar2;
  ValidatorImpl *this_00;
  XmlAttributePtr attribute;
  XmlNodePtr childNode;
  string info;
  __shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  IdMap *local_128;
  string *local_120;
  undefined1 local_118 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_128 = idMap;
  local_120 = infoRef;
  local_118._32_8_ = this;
  XmlNode::firstAttribute((XmlNode *)&local_158);
  while( true ) {
    if (local_158._M_ptr == (XmlAttribute *)0x0) break;
    bVar2 = XmlAttribute::isType(local_158._M_ptr,"id","");
    if (bVar2) {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_148._M_string_length = 0;
      local_148.field_2._M_local_buf[0] = '\0';
      XmlNode::name_abi_cxx11_
                ((string *)local_118,
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      bVar2 = std::operator==((string *)local_118,"ci");
      std::__cxx11::string::~string((string *)local_118);
      if (bVar2) {
        XmlNode::firstChild((XmlNode *)local_118);
        uVar1 = local_118._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
        if ((pointer)uVar1 != (pointer)0x0) {
          XmlNode::firstChild((XmlNode *)(local_118 + 0x28));
          XmlNode::convertToString_abi_cxx11_(&local_70,(XmlNode *)local_f0._M_dataplus._M_p);
          std::operator+(&local_d0,"\'",&local_70);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,&local_d0,"\' ");
          std::__cxx11::string::operator=((string *)&local_148,(string *)local_118);
          std::__cxx11::string::~string((string *)local_118);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        }
      }
      XmlNode::name_abi_cxx11_
                (&local_50,
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      std::operator+(&local_90," - MathML ",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x28),&local_90," element ");
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x28),&local_148);
      std::operator+(&local_d0,&local_70,"in ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     &local_d0,local_120);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)local_118);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)(local_118 + 0x28));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (ValidatorImpl *)local_118;
      XmlAttribute::value_abi_cxx11_((string *)local_118,local_158._M_ptr);
      addIdMapItem(this_00,(string *)local_118,&local_b0,local_128);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::~string((string *)&local_148);
    }
    XmlAttribute::next((XmlAttribute *)&local_148);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_158,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_string_length);
  }
  XmlNode::firstChild((XmlNode *)&local_148);
  while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_148._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) {
    buildMathChildIdMap((ValidatorImpl *)local_118._32_8_,(XmlNodePtr *)&local_148,local_120,
                        local_128);
    XmlNode::next((XmlNode *)local_118);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&local_148,
               (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void Validator::ValidatorImpl::buildMathChildIdMap(const XmlNodePtr &node, const std::string &infoRef, IdMap &idMap)
{
    std::string info;
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("id")) {
            std::string variable;
            if (node->name() == "ci") {
                if (node->firstChild() != nullptr) {
                    variable = "'" + node->firstChild()->convertToString() + "' ";
                }
            }
            info = " - MathML " + node->name() + " element " + variable + "in " + infoRef;
            addIdMapItem(attribute->value(), info, idMap);
        }
        attribute = attribute->next();
    }
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        buildMathChildIdMap(childNode, infoRef, idMap);
        childNode = childNode->next();
    }
}